

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Scanner::scanBlockScalar(Scanner *this,bool IsLiteral)

{
  ilist_node_base<false> *piVar1;
  bool bVar2;
  uint uVar3;
  iterator Position;
  char *pcVar4;
  ilist_node_base<false> *piVar5;
  list_type *plVar6;
  char *in_start;
  uint uVar7;
  size_type NumInputs;
  undefined1 local_1b0 [8];
  SmallString<256U> Str;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined8 uStack_78;
  ilist_node_base<false> *local_70;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  iterator local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  char local_32;
  bool local_31;
  uint BlockIndent;
  char ChompingIndicator;
  bool IsDone;
  
  if ((*this->Current != '>') && (*this->Current != '|')) {
    __assert_fail("*Current == \'|\' || *Current == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLParser.cpp"
                  ,0x5f5,"bool llvm::yaml::Scanner::scanBlockScalar(bool)");
  }
  skip(this,1);
  local_31 = false;
  bVar2 = scanBlockScalarHeader(this,&local_32,&local_38,&local_31);
  if (bVar2) {
    if (local_31 != false) {
      return true;
    }
    NumInputs = 0;
    uVar3 = this->Indent;
    if (this->Indent < 1) {
      uVar3 = 0;
    }
    local_48 = this->Current;
    local_3c = 0;
    if (local_38 == 0) {
      bVar2 = findBlockScalarIndent(this,&local_38,uVar3,&local_3c,&local_31);
      if (!bVar2) goto LAB_00da715b;
      NumInputs = (size_type)local_3c;
    }
    uVar7 = (uint)NumInputs;
    local_1b0 = (undefined1  [8])
                &Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = (void *)0x10000000000;
    if ((local_31 & 1U) == 0) {
      local_40 = local_38;
      while( true ) {
        uVar7 = (uint)NumInputs;
        bVar2 = scanBlockScalarIndent(this,local_40,uVar3,&local_31);
        if (!bVar2) break;
        if (local_31 != false) goto LAB_00da7128;
        in_start = this->Current;
        pcVar4 = in_start;
        do {
          Position = pcVar4;
          pcVar4 = skip_nb_char(this,Position);
        } while (pcVar4 != Position);
        this->Column = this->Column + ((int)Position - *(int *)&this->Current);
        this->Current = pcVar4;
        if (in_start != Position) {
          local_80 = CONCAT31(local_80._1_3_,10);
          SmallVectorImpl<char>::append
                    ((SmallVectorImpl<char> *)local_1b0,NumInputs,(char *)&local_80);
          SmallVectorImpl<char>::append<char_const*,void>
                    ((SmallVectorImpl<char> *)local_1b0,in_start,this->Current);
          in_start = this->Current;
          uVar7 = 0;
        }
        if ((in_start == this->End) || (bVar2 = consumeLineBreakIfPresent(this), !bVar2))
        goto LAB_00da7128;
        NumInputs = (size_type)(uVar7 + 1);
      }
      bVar2 = false;
    }
    else {
LAB_00da7128:
      if (local_32 == '-') {
        uVar3 = 0;
      }
      else if (local_32 == '+') {
        uVar3 = 1;
        if (uVar7 != 0) {
          uVar3 = uVar7;
        }
        if (this->Current != this->End) {
          uVar3 = uVar7;
        }
      }
      else {
        uVar3 = (uint)((int)Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                            super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                      != 0);
      }
      local_80 = CONCAT31(local_80._1_3_,10);
      SmallVectorImpl<char>::append
                ((SmallVectorImpl<char> *)local_1b0,(ulong)uVar3,(char *)&local_80);
      if (this->FlowLevel == 0) {
        this->IsSimpleKeyAllowed = true;
      }
      local_60 = 0;
      local_58 = 0;
      local_80 = 0x13;
      local_70 = (ilist_node_base<false> *)(this->Current + -(long)local_48);
      uStack_78 = local_48;
      local_68 = &local_58;
      if (local_1b0 == (undefined1  [8])0x0) {
        Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
             &local_90;
        local_90 = 0;
      }
      else {
        Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
             &local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   (Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                    InlineElts + 0xf8),local_1b0,
                   ((ulong)Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                   & 0xffffffff) + (long)local_1b0);
      }
      std::__cxx11::string::operator=
                ((string *)&local_68,
                 (string *)
                 (Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
                 + 0xf8));
      if ((undefined1 *)
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_
          != &local_90) {
        operator_delete((void *)Str.super_SmallVector<char,_256U>.
                                super_SmallVectorStorage<char,_256U>.InlineElts._248_8_,
                        CONCAT71(uStack_8f,local_90) + 1);
      }
      piVar5 = (ilist_node_base<false> *)
               BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         (&(this->TokenQueue).
                           super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,
                          (Align)0x4);
      piVar5->Prev = (ilist_node_base<false> *)0x0;
      piVar5->Next = (ilist_node_base<false> *)0x0;
      *(undefined4 *)&piVar5[1].Prev = local_80;
      *(undefined4 *)((long)&piVar5[1].Prev + 4) = uStack_7c;
      *(undefined4 *)&piVar5[1].Next = (undefined4)uStack_78;
      *(undefined4 *)((long)&piVar5[1].Next + 4) = uStack_78._4_4_;
      piVar5[2].Prev = local_70;
      piVar5[2].Next = (ilist_node_base<false> *)&piVar5[3].Next;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&piVar5[2].Next,local_68,local_68 + local_60);
      plVar6 = &(this->TokenQueue).List;
      piVar1 = (plVar6->Sentinel).
               super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
               .super_node_base_type.Prev;
      piVar5->Next = (ilist_node_base<false> *)plVar6;
      piVar5->Prev = piVar1;
      piVar1->Next = piVar5;
      (plVar6->Sentinel).
      super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
      .super_node_base_type.Prev = piVar5;
      if (local_68 != &local_58) {
        operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
      }
      bVar2 = true;
    }
    if (local_1b0 !=
        (undefined1  [8])
        &Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase.Size) {
      free((void *)local_1b0);
    }
  }
  else {
LAB_00da715b:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Scanner::scanBlockScalar(bool IsLiteral) {
  // Eat '|' or '>'
  assert(*Current == '|' || *Current == '>');
  skip(1);

  char ChompingIndicator;
  unsigned BlockIndent;
  bool IsDone = false;
  if (!scanBlockScalarHeader(ChompingIndicator, BlockIndent, IsDone))
    return false;
  if (IsDone)
    return true;

  auto Start = Current;
  unsigned BlockExitIndent = Indent < 0 ? 0 : (unsigned)Indent;
  unsigned LineBreaks = 0;
  if (BlockIndent == 0) {
    if (!findBlockScalarIndent(BlockIndent, BlockExitIndent, LineBreaks,
                               IsDone))
      return false;
  }

  // Scan the block's scalars body.
  SmallString<256> Str;
  while (!IsDone) {
    if (!scanBlockScalarIndent(BlockIndent, BlockExitIndent, IsDone))
      return false;
    if (IsDone)
      break;

    // Parse the current line.
    auto LineStart = Current;
    advanceWhile(&Scanner::skip_nb_char);
    if (LineStart != Current) {
      Str.append(LineBreaks, '\n');
      Str.append(StringRef(LineStart, Current - LineStart));
      LineBreaks = 0;
    }

    // Check for EOF.
    if (Current == End)
      break;

    if (!consumeLineBreakIfPresent())
      break;
    ++LineBreaks;
  }

  if (Current == End && !LineBreaks)
    // Ensure that there is at least one line break before the end of file.
    LineBreaks = 1;
  Str.append(getChompedLineBreaks(ChompingIndicator, LineBreaks, Str), '\n');

  // New lines may start a simple key.
  if (!FlowLevel)
    IsSimpleKeyAllowed = true;

  Token T;
  T.Kind = Token::TK_BlockScalar;
  T.Range = StringRef(Start, Current - Start);
  T.Value = Str.str().str();
  TokenQueue.push_back(T);
  return true;
}